

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O1

void __thiscall libsgp4::Tle::ExtractExponential(Tle *this,string *str,double *val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  runtime_error *prVar5;
  char *pcVar6;
  char cVar7;
  char *pcVar8;
  string temp;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (str->_M_string_length != 0) {
    pcVar6 = (str->_M_dataplus)._M_p;
    pcVar4 = pcVar6 + str->_M_string_length;
    pcVar8 = pcVar6;
    do {
      cVar7 = (char)&local_50;
      if (pcVar8 == pcVar6) {
        cVar2 = *pcVar8;
        if ((cVar2 != ' ') && (cVar2 != '+')) {
          if (cVar2 != '-') {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar5,"Invalid sign");
            goto LAB_0010a603;
          }
          std::__cxx11::string::push_back(cVar7);
        }
        std::__cxx11::string::push_back(cVar7);
      }
      else {
        cVar2 = *pcVar8;
        if (pcVar8 == pcVar4 + -2) {
          if ((cVar2 != '-') && (cVar2 != '+')) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar5,"Invalid exponential sign");
            goto LAB_0010a603;
          }
          std::__cxx11::string::push_back(cVar7);
        }
        else if (9 < (int)cVar2 - 0x30U) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Invalid digit");
LAB_0010a603:
          *(undefined ***)prVar5 = &PTR__runtime_error_0010ed90;
          __cxa_throw(prVar5,&TleException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::string::push_back(cVar7);
      pcVar8 = pcVar8 + 1;
      pcVar6 = (str->_M_dataplus)._M_p;
      pcVar4 = pcVar6 + str->_M_string_length;
    } while (pcVar8 != pcVar4);
  }
  bVar3 = Util::FromString<double>(&local_50,val);
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"Failed to convert value to double");
  *(undefined ***)prVar5 = &PTR__runtime_error_0010ed90;
  __cxa_throw(prVar5,&TleException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Tle::ExtractExponential(const std::string& str, double& val)
{
    std::string temp;

    for (std::string::const_iterator i = str.begin(); i != str.end(); ++i)
    {
        if (i == str.begin())
        {
            if (*i == '-' || *i == '+' || *i == ' ')
            {
                if (*i == '-')
                {
                    temp += *i;
                }
                temp += '0';
                temp += '.';
            }
            else
            {
                throw TleException("Invalid sign");
            }
        }
        else if (i == str.end() - 2)
        {
            if (*i == '-' || *i == '+')
            {
                temp += 'e';
                temp += *i;
            }
            else
            {
                throw TleException("Invalid exponential sign");
            }
        }
        else
        {
            if (isdigit(*i))
            {
                temp += *i;
            }
            else
            {
                throw TleException("Invalid digit");
            }
        }
    }

    if (!Util::FromString<double>(temp, val))
    {
        throw TleException("Failed to convert value to double");
    }
}